

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void __thiscall ConsoleInput::ConsoleInput(ConsoleInput *this)

{
  (this->input)._M_dataplus._M_p = (pointer)&(this->input).field_2;
  (this->input)._M_string_length = 0;
  (this->input).field_2._M_local_buf[0] = '\0';
  (this->input_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->input_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->input_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->input_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->input_mutex).super___mutex_base._M_mutex.__data.__list.__prev + 1) =
       0;
  *(undefined8 *)((long)&(this->input_mutex).super___mutex_base._M_mutex.__data.__list.__next + 1) =
       0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (&this->input,0x800);
  return;
}

Assistant:

ConsoleInput() {
		input.reserve(INPUT_BUFFER_SIZE);
	}